

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode cr_eob_read(Curl_easy *data,Curl_creader *reader,char *buf,size_t blen,size_t *pnread,
                    _Bool *peos)

{
  bufq *pbVar1;
  void *pvVar2;
  long lVar3;
  _Bool _Var4;
  CURLcode CVar5;
  void *pvVar6;
  ulong uVar7;
  size_t len;
  byte bVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t sVar13;
  char *__s;
  _Bool eos;
  bufq *local_70;
  _Bool *local_68;
  char *local_60;
  size_t local_58;
  size_t n;
  size_t nread;
  size_t *local_40;
  Curl_easy *local_38;
  
  pvVar2 = reader->ctx;
  local_58 = blen;
  if ((*(byte *)((long)pvVar2 + 0x70) & 1) == 0) {
    local_70 = (bufq *)((long)pvVar2 + 0x20);
    _Var4 = Curl_bufq_is_empty(local_70);
    if (_Var4) {
      CVar5 = Curl_creader_read(data,reader->next,buf,local_58,&nread,&eos);
      sVar13 = nread;
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      *(byte *)((long)pvVar2 + 0x70) = *(byte *)((long)pvVar2 + 0x70) & 0xfe | eos;
      if (nread != 0) {
        uVar7 = *(ulong *)((long)pvVar2 + 0x60);
        local_68 = peos;
        if ((uVar7 == 0) && (pvVar6 = memchr(buf,0xd,nread), pvVar6 == (void *)0x0)) {
          *pnread = sVar13;
          _Var4 = false;
          CVar5 = CURLE_OK;
          goto LAB_0015200e;
        }
        uVar11 = 0;
        local_60 = buf;
        local_40 = pnread;
        local_38 = data;
        for (uVar12 = 0; pnread = local_40, peos = local_68, pbVar1 = local_70, uVar12 < sVar13;
            uVar12 = uVar12 + 1) {
          if (2 < uVar7) {
            CVar5 = Curl_bufq_cwrite(local_70,buf + uVar11,uVar12 - uVar11,&n);
            if (CVar5 != CURLE_OK) {
              return CVar5;
            }
            CVar5 = Curl_bufq_cwrite(pbVar1,".",1,&n);
            if (CVar5 != CURLE_OK) {
              return CVar5;
            }
            *(undefined8 *)((long)pvVar2 + 0x60) = 0;
            lVar3 = (local_38->state).infilesize;
            if (0 < lVar3) {
              (local_38->state).infilesize = lVar3 + 1;
            }
            uVar7 = 0;
            uVar11 = uVar12;
            buf = local_60;
          }
          uVar10 = uVar7;
          if (buf[uVar12] == ".\r\n.\r\n"[uVar7 + 1]) {
LAB_00151f19:
            uVar7 = uVar10 + 1;
            *(ulong *)((long)pvVar2 + 0x60) = uVar7;
          }
          else {
            *(undefined8 *)((long)pvVar2 + 0x60) = 0;
            uVar10 = 0;
            uVar7 = 0;
            if (buf[uVar12] == '\r') goto LAB_00151f19;
          }
          sVar13 = nread;
        }
        if ((uVar11 <= sVar13 && sVar13 - uVar11 != 0) &&
           (CVar5 = Curl_bufq_cwrite(local_70,buf + uVar11,sVar13 - uVar11,&n), CVar5 != CURLE_OK))
        {
          return CVar5;
        }
      }
      if ((*(byte *)((long)pvVar2 + 0x70) & 1) != 0) {
        pcVar9 = "\r\n.\r\n";
        if (*(long *)((long)pvVar2 + 0x60) == 3) {
          pcVar9 = ".\r\n.\r\n";
        }
        __s = ".\r\n";
        if (*(long *)((long)pvVar2 + 0x60) != 2) {
          __s = pcVar9;
        }
        len = strlen(__s);
        CVar5 = Curl_bufq_cwrite(local_70,__s,len,&n);
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
      }
    }
  }
  *peos = false;
  pbVar1 = (bufq *)((long)pvVar2 + 0x20);
  _Var4 = Curl_bufq_is_empty(pbVar1);
  if (_Var4) {
    *pnread = 0;
    CVar5 = CURLE_OK;
  }
  else {
    CVar5 = Curl_bufq_cread(pbVar1,buf,local_58,pnread);
  }
  bVar8 = *(byte *)((long)pvVar2 + 0x70);
  if ((bVar8 & 1) != 0) {
    _Var4 = Curl_bufq_is_empty(pbVar1);
    bVar8 = *(byte *)((long)pvVar2 + 0x70);
    if (_Var4) {
      bVar8 = bVar8 | 2;
      *(byte *)((long)pvVar2 + 0x70) = bVar8;
    }
  }
  _Var4 = (_Bool)(bVar8 >> 1 & 1);
  local_68 = peos;
LAB_0015200e:
  *local_68 = _Var4;
  return CVar5;
}

Assistant:

static CURLcode cr_eob_read(struct Curl_easy *data,
                            struct Curl_creader *reader,
                            char *buf, size_t blen,
                            size_t *pnread, bool *peos)
{
  struct cr_eob_ctx *ctx = reader->ctx;
  CURLcode result = CURLE_OK;
  size_t nread, i, start, n;
  bool eos;

  if(!ctx->read_eos && Curl_bufq_is_empty(&ctx->buf)) {
    /* Get more and convert it when needed */
    result = Curl_creader_read(data, reader->next, buf, blen, &nread, &eos);
    if(result)
      return result;

    ctx->read_eos = eos;
    if(nread) {
      if(!ctx->n_eob && !memchr(buf, SMTP_EOB[0], nread)) {
        /* not in the middle of a match, no EOB start found, just pass */
        *pnread = nread;
        *peos = FALSE;
        return CURLE_OK;
      }
      /* scan for EOB (continuation) and convert */
      for(i = start = 0; i < nread; ++i) {
        if(ctx->n_eob >= SMTP_EOB_FIND_LEN) {
          /* matched the EOB prefix and seeing additional char, add '.' */
          result = Curl_bufq_cwrite(&ctx->buf, buf + start, i - start, &n);
          if(result)
            return result;
          result = Curl_bufq_cwrite(&ctx->buf, ".", 1, &n);
          if(result)
            return result;
          ctx->n_eob = 0;
          start = i;
          if(data->state.infilesize > 0)
            data->state.infilesize++;
        }

        if(buf[i] != SMTP_EOB[ctx->n_eob])
          ctx->n_eob = 0;

        if(buf[i] == SMTP_EOB[ctx->n_eob]) {
          /* matching another char of the EOB */
          ++ctx->n_eob;
        }
      }

      /* add any remainder to buf */
      if(start < nread) {
        result = Curl_bufq_cwrite(&ctx->buf, buf + start, nread - start, &n);
        if(result)
          return result;
      }
    }

    if(ctx->read_eos) {
      /* if we last matched a CRLF or if the data was empty, add ".\r\n"
       * to end the body. If we sent something and it did not end with "\r\n",
       * add "\r\n.\r\n" to end the body */
      const char *eob = SMTP_EOB;
      switch(ctx->n_eob) {
        case 2:
          /* seen a CRLF at the end, just add the remainder */
          eob = &SMTP_EOB[2];
          break;
        case 3:
          /* ended with '\r\n.', we should escpe the last '.' */
          eob = "." SMTP_EOB;
          break;
        default:
          break;
      }
      result = Curl_bufq_cwrite(&ctx->buf, eob, strlen(eob), &n);
      if(result)
        return result;
    }
  }

  *peos = FALSE;
  if(!Curl_bufq_is_empty(&ctx->buf)) {
    result = Curl_bufq_cread(&ctx->buf, buf, blen, pnread);
  }
  else
    *pnread = 0;

  if(ctx->read_eos && Curl_bufq_is_empty(&ctx->buf)) {
    /* no more data, read all, done. */
    ctx->eos = TRUE;
  }
  *peos = ctx->eos;
  DEBUGF(infof(data, "cr_eob_read(%zu) -> %d, %zd, %d",
         blen, result, *pnread, *peos));
  return result;
}